

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_comm.c
# Opt level: O3

void nuke_pets(CHAR_DATA *ch)

{
  CHAR_DATA *ch_00;
  
  ch_00 = ch->pet;
  if (ch_00 != (CHAR_DATA *)0x0) {
    stop_follower(ch_00);
    if (ch_00->in_room != (ROOM_INDEX_DATA *)0x0) {
      act("$N slowly fades away.",ch,(void *)0x0,ch_00,1);
    }
    extract_char(ch_00,true);
  }
  ch->pet = (CHAR_DATA *)0x0;
  return;
}

Assistant:

void nuke_pets(CHAR_DATA *ch)
{
	auto pet = ch->pet;
	if (pet != nullptr)
	{
		stop_follower(pet);
		if (pet->in_room != nullptr)
			act("$N slowly fades away.", ch, nullptr, pet, TO_NOTVICT);

		extract_char(pet, true);
	}

	ch->pet = nullptr;
}